

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

uint SOIL_load_OGL_cubemap
               (char *x_pos_file,char *x_neg_file,char *y_pos_file,char *y_neg_file,char *z_pos_file
               ,char *z_neg_file,int force_channels,uint reuse_texture_ID,uint flags)

{
  int iVar1;
  uint local_58;
  int local_54;
  uint tex_id;
  int channels;
  int height;
  int width;
  uchar *img;
  char *z_neg_file_local;
  char *z_pos_file_local;
  char *y_neg_file_local;
  char *y_pos_file_local;
  char *x_neg_file_local;
  char *x_pos_file_local;
  
  if (((((x_pos_file == (char *)0x0) || (x_neg_file == (char *)0x0)) || (y_pos_file == (char *)0x0))
      || ((y_neg_file == (char *)0x0 || (z_pos_file == (char *)0x0)))) ||
     (z_neg_file == (char *)0x0)) {
    result_string_pointer = "Invalid cube map files list";
    x_pos_file_local._4_4_ = 0;
  }
  else {
    img = (uchar *)z_neg_file;
    z_neg_file_local = z_pos_file;
    z_pos_file_local = y_neg_file;
    y_neg_file_local = y_pos_file;
    y_pos_file_local = x_neg_file;
    x_neg_file_local = x_pos_file;
    iVar1 = query_cubemap_capability();
    if (iVar1 == 1) {
      _height = SOIL_load_image(x_neg_file_local,&channels,(int *)&tex_id,&local_54,force_channels);
      if ((0 < force_channels) && (force_channels < 5)) {
        local_54 = force_channels;
      }
      if (_height == (uchar *)0x0) {
        result_string_pointer = stbi_failure_reason();
        x_pos_file_local._4_4_ = 0;
      }
      else {
        local_58 = SOIL_internal_create_OGL_texture
                             (_height,channels,tex_id,local_54,reuse_texture_ID,flags,0x8513,0x8515,
                              0x851c);
        SOIL_free_image_data(_height);
        if (local_58 != 0) {
          _height = SOIL_load_image(y_pos_file_local,&channels,(int *)&tex_id,&local_54,
                                    force_channels);
          if ((0 < force_channels) && (force_channels < 5)) {
            local_54 = force_channels;
          }
          if (_height == (uchar *)0x0) {
            result_string_pointer = stbi_failure_reason();
            return 0;
          }
          local_58 = SOIL_internal_create_OGL_texture
                               (_height,channels,tex_id,local_54,local_58,flags,0x8513,0x8516,0x851c
                               );
          SOIL_free_image_data(_height);
        }
        if (local_58 != 0) {
          _height = SOIL_load_image(y_neg_file_local,&channels,(int *)&tex_id,&local_54,
                                    force_channels);
          if ((0 < force_channels) && (force_channels < 5)) {
            local_54 = force_channels;
          }
          if (_height == (uchar *)0x0) {
            result_string_pointer = stbi_failure_reason();
            return 0;
          }
          local_58 = SOIL_internal_create_OGL_texture
                               (_height,channels,tex_id,local_54,local_58,flags,0x8513,0x8517,0x851c
                               );
          SOIL_free_image_data(_height);
        }
        if (local_58 != 0) {
          _height = SOIL_load_image(z_pos_file_local,&channels,(int *)&tex_id,&local_54,
                                    force_channels);
          if ((0 < force_channels) && (force_channels < 5)) {
            local_54 = force_channels;
          }
          if (_height == (uchar *)0x0) {
            result_string_pointer = stbi_failure_reason();
            return 0;
          }
          local_58 = SOIL_internal_create_OGL_texture
                               (_height,channels,tex_id,local_54,local_58,flags,0x8513,0x8518,0x851c
                               );
          SOIL_free_image_data(_height);
        }
        if (local_58 != 0) {
          _height = SOIL_load_image(z_neg_file_local,&channels,(int *)&tex_id,&local_54,
                                    force_channels);
          if ((0 < force_channels) && (force_channels < 5)) {
            local_54 = force_channels;
          }
          if (_height == (uchar *)0x0) {
            result_string_pointer = stbi_failure_reason();
            return 0;
          }
          local_58 = SOIL_internal_create_OGL_texture
                               (_height,channels,tex_id,local_54,local_58,flags,0x8513,0x8519,0x851c
                               );
          SOIL_free_image_data(_height);
        }
        if (local_58 != 0) {
          _height = SOIL_load_image((char *)img,&channels,(int *)&tex_id,&local_54,force_channels);
          if ((0 < force_channels) && (force_channels < 5)) {
            local_54 = force_channels;
          }
          if (_height == (uchar *)0x0) {
            result_string_pointer = stbi_failure_reason();
            return 0;
          }
          local_58 = SOIL_internal_create_OGL_texture
                               (_height,channels,tex_id,local_54,local_58,flags,0x8513,0x851a,0x851c
                               );
          SOIL_free_image_data(_height);
        }
        x_pos_file_local._4_4_ = local_58;
      }
    }
    else {
      result_string_pointer = "No cube map capability present";
      x_pos_file_local._4_4_ = 0;
    }
  }
  return x_pos_file_local._4_4_;
}

Assistant:

unsigned int
	SOIL_load_OGL_cubemap
	(
		const char *x_pos_file,
		const char *x_neg_file,
		const char *y_pos_file,
		const char *y_neg_file,
		const char *z_pos_file,
		const char *z_neg_file,
		int force_channels,
		unsigned int reuse_texture_ID,
		unsigned int flags
	)
{
	/*	variables	*/
	unsigned char* img;
	int width, height, channels;
	unsigned int tex_id;
	/*	error checking	*/
	if( (x_pos_file == NULL) ||
		(x_neg_file == NULL) ||
		(y_pos_file == NULL) ||
		(y_neg_file == NULL) ||
		(z_pos_file == NULL) ||
		(z_neg_file == NULL) )
	{
		result_string_pointer = "Invalid cube map files list";
		return 0;
	}
	/*	capability checking	*/
	if( query_cubemap_capability() != SOIL_CAPABILITY_PRESENT )
	{
		result_string_pointer = "No cube map capability present";
		return 0;
	}
	/*	1st face: try to load the image	*/
	img = SOIL_load_image( x_pos_file, &width, &height, &channels, force_channels );
	/*	channels holds the original number of channels, which may have been forced	*/
	if( (force_channels >= 1) && (force_channels <= 4) )
	{
		channels = force_channels;
	}
	if( NULL == img )
	{
		/*	image loading failed	*/
		result_string_pointer = stbi_failure_reason();
		return 0;
	}
	/*	upload the texture, and create a texture ID if necessary	*/
	tex_id = SOIL_internal_create_OGL_texture(
			img, width, height, channels,
			reuse_texture_ID, flags,
			SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_POSITIVE_X,
			SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
	/*	and nuke the image data	*/
	SOIL_free_image_data( img );
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image( x_neg_file, &width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_NEGATIVE_X,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image( y_pos_file, &width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_POSITIVE_Y,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image( y_neg_file, &width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image( z_pos_file, &width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_POSITIVE_Z,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image( z_neg_file, &width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_NEGATIVE_Z,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	and return the handle, such as it is	*/
	return tex_id;
}